

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void recharge(obj *obj,int curse_bless)

{
  ushort uVar1;
  obj *poVar2;
  char cVar3;
  char cVar4;
  schar sVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  monst *pmVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  char *pcVar13;
  char cVar14;
  int tmp;
  int iVar15;
  char *pcVar16;
  obj *poVar17;
  int iVar18;
  bool bVar19;
  bool bVar20;
  long local_38;
  
  if (-1 < curse_bless) {
    obj->field_0x4a = obj->field_0x4a | 0x10;
  }
  cVar3 = obj->oclass;
  if (cVar3 == '\x04') {
    if ((objects[obj->otyp].field_0x10 & 0x20) != 0) {
      if (curse_bless < 1) {
        uVar7 = 1;
        if (curse_bless < 0) {
          uVar7 = mt_random();
          uVar7 = ~uVar7 | 0xfffffffe;
        }
      }
      else {
        uVar7 = mt_random();
        uVar7 = uVar7 % 3 + 1;
      }
      bVar20 = uleft == obj;
      bVar19 = uright == obj;
      cVar3 = obj->spe;
      uVar6 = mt_random();
      poVar17 = uleft;
      if (((int)(uVar6 % 6 + 3) < (int)cVar3) || ((curse_bless < 0 && (obj->spe < -4)))) {
        pcVar16 = xname(obj);
        pcVar13 = otense(obj,"pulsate");
        pcVar8 = otense(obj,"explode");
        pline("Your %s %s momentarily, then %s!",pcVar16,pcVar13,pcVar8);
        if (bVar19 || bVar20) {
          Ring_gone(obj);
        }
        bVar11 = obj->spe >> 7;
        bVar11 = (obj->spe ^ bVar11) - bVar11;
        uVar7 = mt_random();
        useup(obj);
        losehp(uVar7 % ((uint)bVar11 + (uint)bVar11 * 2) + 1,"exploding ring",0);
        return;
      }
      pcVar16 = xname(obj);
      pcVar13 = "";
      if ((int)uVar7 < 0) {
        pcVar13 = "counter";
      }
      pline("Your %s spins %sclockwise for a moment.",pcVar16,pcVar13);
      if (!bVar19 && !bVar20) {
        obj->spe = obj->spe + (char)uVar7;
        return;
      }
      Ring_off(obj);
      obj->spe = obj->spe + (char)uVar7;
      setworn(obj,(ulong)(poVar17 != obj) * 0x20000 + 0x20000);
      Ring_on(obj,'\0');
      return;
    }
    goto switchD_0022fb84_caseD_e9;
  }
  if (cVar3 != '\x06') {
    if (cVar3 == '\v') {
      if (obj->spe == -1) {
        obj->spe = '\0';
      }
      uVar7 = *(uint *)&obj->field_0x4a;
      uVar12 = uVar7 >> 0x10 & 7;
      uVar6 = uVar7;
      if (uVar12 != 0) {
        if ((obj->otyp == 0x1c2) || (uVar6 = mt_random(), uVar6 % 0x157 < uVar12 * uVar12 * uVar12))
        goto LAB_0022fa72;
        uVar6 = *(uint *)&obj->field_0x4a;
      }
      *(uint *)&obj->field_0x4a = uVar6 & 0xfff8ffff | uVar7 + 0x10000 & 0x70000;
      if (curse_bless < 0) goto LAB_0022ff50;
      iVar15 = 3;
      uVar7 = 3;
      if ((long)obj->otyp != 0x1c2) {
        iVar15 = 8;
        if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0xc) == 4) {
          iVar15 = 0xf;
        }
        uVar7 = mt_random();
        uVar7 = (iVar15 + uVar7 % 5) - 4;
      }
      if (curse_bless < 1) {
        uVar6 = mt_random();
        uVar7 = uVar6 % uVar7 + 1;
      }
      cVar3 = obj->spe + '\x01';
      if ((int)obj->spe < (int)uVar7) {
        cVar3 = (char)uVar7;
      }
      obj->spe = cVar3;
      if ((obj->otyp == 0x1c2) && ('\x03' < cVar3)) {
LAB_0022fa72:
        wand_explode(obj);
        return;
      }
      if (cVar3 < iVar15) goto LAB_00230031;
      goto LAB_0022feff;
    }
    goto switchD_0022fb84_caseD_e9;
  }
  uVar7 = *(uint *)&obj->field_0x4a;
  uVar6 = uVar7 >> 0x10 & 7;
  if (uVar6 != 7) {
    uVar7 = uVar7 & 0xfff8ffff | uVar7 + 0x10000 & 0x70000;
    *(uint *)&obj->field_0x4a = uVar7;
  }
  uVar1 = obj->otyp;
  switch(uVar1) {
  case 0xe7:
  case 0xe8:
    if (curse_bless < 0) {
      stripspe(obj);
      if ((obj->field_0x4c & 8) == 0) {
        return;
      }
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0022ffd9;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022ffd0;
      }
      else {
LAB_0022ffd0:
        if (ublindf == (obj *)0x0) goto LAB_00230114;
LAB_0022ffd9:
        if (ublindf->oartifact != '\x1d') goto LAB_00230114;
      }
      pcVar16 = Tobjnam(obj,"go");
      pline("%s out!",pcVar16);
LAB_00230114:
      end_burn(obj,'\x01');
      return;
    }
    obj->spe = '\x01';
    if (curse_bless < 1) {
      iVar15 = 0x5dc;
      if (obj->age < 0x2ef) {
        iVar15 = obj->age + 0x2ee;
      }
      obj->age = iVar15;
      goto LAB_00230031;
    }
    obj->age = 0x5dc;
    break;
  case 0xea:
  case 0xf3:
  case 0xf7:
    if (curse_bless < 0) goto LAB_0022ff50;
    if (uVar1 == 0xf7 && uVar6 != 0) {
      *(uint *)&obj->field_0x4a = uVar7 & 0xfff8ffff | 0x10000;
      if (obj->spe < '\x03') {
        pcVar16 = "Your marker seems permanently dried out.";
        goto LAB_0022fb3b;
      }
LAB_002300a3:
      pcVar16 = "Nothing happens.";
      goto LAB_0022fb3b;
    }
    uVar7 = mt_random();
    if (curse_bless < 1) {
      iVar18 = (uVar7 - (uVar7 / 0xb + (uVar7 / 0xb) * 10)) + (int)obj->spe + 10;
      iVar15 = 0x7f;
      if (iVar18 < 0x7f) {
        iVar15 = iVar18;
      }
      sVar5 = '2';
      if (0x32 < iVar18) {
        sVar5 = (schar)iVar15;
      }
      obj->spe = sVar5;
      pcVar16 = "dark white";
      goto LAB_0022ff06;
    }
    uVar6 = (int)obj->spe + (uVar7 & 0xf) + 0xf;
    uVar7 = 0x32;
    if (((0x32 < (int)uVar6) && (uVar7 = 0x4b, 0x4b < uVar6)) && (uVar7 = 0x7f, uVar6 < 0x7f)) {
      uVar7 = uVar6;
    }
    obj->spe = (schar)uVar7;
    break;
  case 0xec:
    if (curse_bless < 0) goto LAB_0022ff50;
    if (curse_bless < 1) {
      if (obj->spe < '\x05') {
        obj->spe = obj->spe + '\x01';
        goto LAB_00230031;
      }
      goto LAB_002300a3;
    }
    obj->spe = '\x06';
    break;
  case 0xf5:
switchD_0022fb84_caseD_f5:
    if (curse_bless < 0) {
LAB_0022ff50:
      stripspe(obj);
      return;
    }
LAB_0022fec6:
    if (curse_bless < 1) {
      uVar7 = mt_random();
      cVar3 = (char)uVar7 + (char)(uVar7 / 5) * -5 + obj->spe;
      cVar4 = cVar3 + '\x01';
      bVar20 = SBORROW1(cVar4,'2');
      cVar3 = cVar3 + -0x31;
      cVar14 = '2';
LAB_00230010:
      if (bVar20 != cVar3 < '\0') {
        cVar14 = cVar4;
      }
      obj->spe = cVar14;
LAB_00230031:
      p_glow1(obj);
      return;
    }
    cVar3 = obj->spe;
    uVar7 = mt_random();
    cVar3 = (char)(uVar7 % ((uint)(cVar3 < '\v') * 5 + 5)) + obj->spe;
    cVar14 = cVar3 + '\x06';
    bVar20 = SBORROW1(cVar14,'2');
    cVar3 = cVar3 + -0x2c;
    cVar4 = '2';
LAB_0022fef9:
    if (bVar20 != cVar3 < '\0') {
      cVar4 = cVar14;
    }
    obj->spe = cVar4;
    break;
  default:
    uVar7 = uVar1 - 0xfd;
    if (uVar7 < 0x10) {
      if ((0x44dU >> (uVar7 & 0x1f) & 1) == 0) {
        if (uVar7 == 4) goto switchD_0022fb84_caseD_f5;
        if (uVar7 == 0xf) {
          if (curse_bless < 0) {
            stripspe(obj);
            cVar3 = obj->spe;
          }
          else {
            if (curse_bless < 1) {
              cVar3 = obj->spe;
            }
            else {
              uVar7 = mt_random();
              cVar3 = (char)uVar7 + (char)(uVar7 / 3) * -3 + obj->spe;
            }
            cVar3 = cVar3 + '\x01';
            obj->spe = cVar3;
          }
          if (cVar3 < '\x06') {
            return;
          }
          obj->spe = '\x05';
          return;
        }
        goto LAB_0022fdb6;
      }
      if (curse_bless < 0) goto LAB_0022ff50;
      if (curse_bless < 1) {
        uVar7 = mt_random();
        cVar3 = ((byte)uVar7 & 3) + obj->spe;
        cVar4 = cVar3 + '\x01';
        bVar20 = SBORROW1(cVar4,'\x14');
        cVar3 = cVar3 + -0x13;
        cVar14 = '\x14';
        goto LAB_00230010;
      }
      iVar15 = 2;
      iVar18 = -2;
      do {
        uVar7 = mt_random();
        iVar15 = iVar15 + (uVar7 & 3);
        iVar18 = iVar18 + 1;
      } while (iVar18 != 0);
      cVar14 = (char)iVar15 + obj->spe;
      bVar20 = SBORROW1(cVar14,'\x14');
      cVar3 = cVar14 + -0x14;
      cVar4 = '\x14';
      goto LAB_0022fef9;
    }
LAB_0022fdb6:
    if (uVar1 == 0xe1) {
      if (curse_bless < 0) goto LAB_0022ff50;
      iVar15 = 1;
      discover_object(0xe1,'\x01','\x01');
      if (obj->cobj != (obj *)0x0) {
        local_38 = 0;
        poVar17 = obj->cobj;
        do {
          poVar2 = poVar17->nobj;
          obj_extract_self(poVar17);
          if (((u.ushops[0] != '\0') &&
              (pmVar9 = shop_keeper(level,u.ushops[0]), pmVar9 != (monst *)0x0)) &&
             ((poVar17->field_0x4a & 4) != 0)) {
            lVar10 = stolen_value(poVar17,u.ux,u.uy,(byte)(*(uint *)&pmVar9->field_0x60 >> 0x16) & 1
                                  ,'\x01');
            local_38 = local_38 + lVar10;
          }
          obfree(poVar17,(obj *)0x0);
          iVar15 = iVar15 + -1;
          poVar17 = poVar2;
        } while (poVar2 != (obj *)0x0);
        pcVar16 = yname(obj);
        You_hear("loud crunching sounds from inside %s.",pcVar16);
        if (local_38 != 0) {
          pcVar16 = currency(local_38);
          pcVar13 = "s";
          if (iVar15 == 0) {
            pcVar13 = "";
          }
          pline("You owe %ld %s for lost item%s.",local_38,pcVar16,pcVar13);
        }
        goto switchD_0022fb84_caseD_f5;
      }
      goto LAB_0022fec6;
    }
  case 0xe9:
  case 0xeb:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf4:
  case 0xf6:
switchD_0022fb84_caseD_e9:
    pcVar16 = "You have a feeling of loss.";
LAB_0022fb3b:
    pline(pcVar16);
    return;
  }
LAB_0022feff:
  pcVar16 = "dark blue";
LAB_0022ff06:
  p_glow2(obj,pcVar16 + 5);
  return;
}

Assistant:

void recharge(struct obj *obj, int curse_bless)
{
	int n;
	boolean is_cursed, is_blessed;

	is_cursed = curse_bless < 0;
	is_blessed = curse_bless > 0;

	/* Scrolls of charging now ID charge count, as well as doing
	 * the charging, unless cursed. */
	if (!is_cursed) obj->known = 1;

	if (obj->oclass == WAND_CLASS) {
	    /* undo any prior cancellation, even when is_cursed */
	    if (obj->spe == -1) obj->spe = 0;

	    /*
	     * Recharging might cause wands to explode.
	     *	v = number of previous recharges
	     *	      v = percentage chance to explode on this attempt
	     *		      v = cumulative odds for exploding
	     *	0 :   0       0
	     *	1 :   0.29    0.29
	     *	2 :   2.33    2.62
	     *	3 :   7.87   10.28
	     *	4 :  18.66   27.02
	     *	5 :  36.44   53.62
	     *	6 :  62.97   82.83
	     *	7 : 100     100
	     */
	    n = (int)obj->recharged;
	    if (n > 0 && (obj->otyp == WAN_WISHING ||
		    (n * n * n > rn2(7*7*7)))) {	/* recharge_limit */
		wand_explode(obj);
		return;
	    }
	    /* didn't explode, so increment the recharge count */
	    obj->recharged = (unsigned)(n + 1);

	    /* now handle the actual recharging */
	    if (is_cursed) {
		stripspe(obj);
	    } else {
		int lim = (obj->otyp == WAN_WISHING) ? 3 :
			(objects[obj->otyp].oc_dir != NODIR) ? 8 : 15;

		n = (lim == 3) ? 3 : rn1(5, lim + 1 - 5);
		if (!is_blessed) n = rnd(n);

		if (obj->spe < n) obj->spe = n;
		else obj->spe++;
		if (obj->otyp == WAN_WISHING && obj->spe > 3) {
		    wand_explode(obj);
		    return;
		}
		if (obj->spe >= lim) p_glow2(obj, "blue");
		else p_glow1(obj);
	    }

	} else if (obj->oclass == RING_CLASS &&
					objects[obj->otyp].oc_charged) {
	    /* charging does not affect ring's curse/bless status */
	    int s = is_blessed ? rnd(3) : is_cursed ? -rnd(2) : 1;
	    boolean is_on = (obj == uleft || obj == uright);

	    /* destruction depends on current state, not adjustment */
	    if (obj->spe > rn2(6) + 3 || (is_cursed && obj->spe <= -5)) {
		pline("Your %s %s momentarily, then %s!",
		     xname(obj), otense(obj,"pulsate"), otense(obj,"explode"));
		if (is_on) Ring_gone(obj);
		s = rnd(3 * abs(obj->spe));	/* amount of damage */
		useup(obj);
		losehp(s, "exploding ring", KILLED_BY_AN);
	    } else {
		long mask = is_on ? (obj == uleft ? LEFT_RING :
				     RIGHT_RING) : 0L;
		pline("Your %s spins %sclockwise for a moment.",
		     xname(obj), s < 0 ? "counter" : "");
		/* cause attributes and/or properties to be updated */
		if (is_on) Ring_off(obj);
		obj->spe += s;	/* update the ring while it's off */
		if (is_on) setworn(obj, mask), Ring_on(obj, FALSE);
		/* oartifact: if a touch-sensitive artifact ring is
		   ever created the above will need to be revised  */
	    }

	} else if (obj->oclass == TOOL_CLASS) {
	    int rechrg = (int)obj->recharged;

	    /* tools don't have a limit, but the counter used does */
	    if (rechrg < 7)	/* recharge_limit */
		obj->recharged++;

	    switch(obj->otyp) {
	    case BELL_OF_OPENING:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) obj->spe += rnd(3);
		else obj->spe += 1;
		if (obj->spe > 5) obj->spe = 5;
		break;
	    case MAGIC_MARKER:
	    case TINNING_KIT:
	    case EXPENSIVE_CAMERA:
		if (is_cursed) stripspe(obj);
		else if (rechrg && obj->otyp == MAGIC_MARKER) {	/* previously recharged */
		    obj->recharged = 1;	/* override increment done above */
		    if (obj->spe < 3)
			pline("Your marker seems permanently dried out.");
		    else
			pline("Nothing happens.");
		} else if (is_blessed) {
		    n = rn1(16,15);		/* 15..30 */
		    if (obj->spe + n <= 50)
			obj->spe = 50;
		    else if (obj->spe + n <= 75)
			obj->spe = 75;
		    else {
			int chrg = (int)obj->spe;
			if ((chrg + n) > 127)
				obj->spe = 127;
			else
				obj->spe += n;
		    }
		    p_glow2(obj, "blue");
		} else {
		    n = rn1(11,10);		/* 10..20 */
		    if (obj->spe + n <= 50)
			obj->spe = 50;
		    else {
			int chrg = (int)obj->spe;
			if ((chrg + n) > 127)
				obj->spe = 127;
			else
				obj->spe += n;
		    }
		    p_glow2(obj, "white");
		}
		break;
	    case OIL_LAMP:
	    case BRASS_LANTERN:
		if (is_cursed) {
		    stripspe(obj);
		    if (obj->lamplit) {
			if (!Blind)
			    pline("%s out!", Tobjnam(obj, "go"));
			end_burn(obj, TRUE);
		    }
		} else if (is_blessed) {
		    obj->spe = 1;
		    obj->age = 1500;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe = 1;
		    obj->age += 750;
		    if (obj->age > 1500) obj->age = 1500;
		    p_glow1(obj);
		}
		break;
	    case CRYSTAL_BALL:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) {
		    obj->spe = 6;
		    p_glow2(obj, "blue");
		} else {
		    if (obj->spe < 5) {
			obj->spe++;
			p_glow1(obj);
		    } else pline("Nothing happens.");
		}
		break;
	    case BAG_OF_TRICKS:
		/* if there are any objects inside the bag, devour them */
		if (!is_cursed) {
		    struct obj *curr, *otmp;
		    struct monst *shkp;
		    int lcnt = 0;
		    long loss = 0L;

		    makeknown(BAG_OF_TRICKS);
		    for (curr = obj->cobj; curr; curr = otmp) {
			otmp = curr->nobj;
			obj_extract_self(curr);
			lcnt++;
			if (*u.ushops && (shkp = shop_keeper(level, *u.ushops)) != 0) {
			    if (curr->unpaid)
				loss += stolen_value(curr, u.ux, u.uy,
						     (boolean)shkp->mpeaceful, TRUE);
			}
			/* obfree() will free all contained objects */
			obfree(curr, NULL);
		    }

		    if (lcnt)
			You_hear("loud crunching sounds from inside %s.", yname(obj));
		    if (lcnt && loss)
			pline("You owe %ld %s for lost item%s.",
			      loss, currency(loss), lcnt > 1 ? "s" : "");
		}
		/* fall through */
	    case HORN_OF_PLENTY:
	    case CAN_OF_GREASE:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) {
		    if (obj->spe <= 10)
			obj->spe += rn1(10, 6);
		    else obj->spe += rn1(5, 6);
		    if (obj->spe > 50) obj->spe = 50;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe += rnd(5);
		    if (obj->spe > 50) obj->spe = 50;
		    p_glow1(obj);
		}
		break;
	    case MAGIC_FLUTE:
	    case MAGIC_HARP:
	    case FROST_HORN:
	    case FIRE_HORN:
	    case DRUM_OF_EARTHQUAKE:
		if (is_cursed) {
		    stripspe(obj);
		} else if (is_blessed) {
		    obj->spe += dice(2,4);
		    if (obj->spe > 20) obj->spe = 20;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe += rnd(4);
		    if (obj->spe > 20) obj->spe = 20;
		    p_glow1(obj);
		}
		break;
	    default:
		goto not_chargable;
		/*NOTREACHED*/
		break;
	    } /* switch */

	} else {
 not_chargable:
	    pline("You have a feeling of loss.");
	}
}